

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O3

FT_Error af_latin_hints_compute_segments(AF_GlyphHints hints,AF_Dimension dim)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  FT_Char FVar8;
  FT_Short FVar9;
  FT_Short FVar10;
  FT_Short FVar11;
  AF_AxisHintsRec *pAVar12;
  AF_Direction AVar13;
  AF_Segment_conflict pAVar14;
  AF_Segment_conflict pAVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  byte bVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  AF_Direction AVar24;
  long lVar25;
  AF_Segment_conflict pAVar26;
  AF_Direction AVar27;
  long lVar28;
  ulong uVar29;
  short sVar30;
  AF_Point_conflict point;
  AF_Point_conflict pAVar31;
  long lVar32;
  short sVar33;
  AF_Point_conflict limit;
  AF_Point_conflict pAVar34;
  long lVar35;
  long lVar36;
  AF_Segment_conflict pAVar37;
  AF_Point pAVar38;
  bool bVar39;
  bool bVar40;
  byte bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar45 [16];
  uint local_fc;
  uint local_f8;
  FT_Error local_f4;
  undefined8 local_f0;
  uint local_e8;
  uint local_e4;
  long local_e0;
  long local_d8;
  AF_Direction local_cc;
  long local_c8;
  long local_c0;
  AF_Segment_conflict local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  AF_AxisHintsRec *local_98;
  AF_Point_conflict local_90;
  FT_Memory local_88;
  undefined8 local_80;
  AF_Point_conflict *local_78;
  AF_Point_conflict *local_70;
  undefined1 local_68 [16];
  undefined8 uStack_58;
  undefined7 uStack_50;
  undefined4 local_49;
  undefined4 uStack_45;
  undefined4 uStack_41;
  undefined4 uStack_3d;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined2 uVar48;
  
  bVar41 = 0;
  local_88 = hints->memory;
  local_70 = hints->contours;
  iVar3 = hints->num_contours;
  uVar22 = *(uint *)&hints->metrics[1].style_class;
  uStack_45 = 0;
  uStack_41 = 0;
  uStack_3d = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_49 = 0;
  local_68 = (undefined1  [16])0x0;
  AVar27 = hints->axis[dim].major_dir;
  local_cc = -AVar27;
  if (~AF_DIR_LEFT < AVar27) {
    local_cc = AVar27;
  }
  hints->axis[dim].num_segments = 0;
  pAVar31 = hints->points;
  iVar4 = hints->num_points;
  pAVar34 = pAVar31 + iVar4;
  if (dim == AF_DIMENSION_HORZ) {
    if (0 < iVar4) {
      do {
        uVar29._0_2_ = pAVar31->fx;
        uVar29._2_2_ = pAVar31->fy;
        uVar29._4_4_ = *(undefined4 *)&pAVar31->field_0x1c;
        uVar48 = (undefined2)((uint)uVar29._4_4_ >> 0x10);
        auVar47._8_4_ = 0;
        auVar47._0_8_ = uVar29;
        auVar47._12_2_ = uVar48;
        auVar47._14_2_ = uVar48;
        auVar46._12_4_ = auVar47._12_4_;
        auVar46._8_2_ = 0;
        auVar46._0_8_ = uVar29;
        auVar46._10_2_ = (short)uVar29._4_4_;
        auVar45._10_6_ = auVar46._10_6_;
        auVar45._8_2_ = (short)uVar29._4_4_;
        auVar45._0_8_ = uVar29;
        auVar7._4_8_ = auVar45._8_8_;
        auVar7._2_2_ = uVar29._2_2_;
        auVar7._0_2_ = uVar29._2_2_;
        *(int *)&pAVar31->u = (int)(short)(undefined2)uVar29;
        *(uint *)((long)&pAVar31->u + 4) = -(uint)((short)(undefined2)uVar29 < 0);
        *(int *)&pAVar31->v = auVar7._0_4_ >> 0x10;
        *(uint *)((long)&pAVar31->v + 4) = -(uint)(auVar7._0_4_ < 0);
        pAVar31 = pAVar31 + 1;
      } while (pAVar31 < pAVar34);
    }
  }
  else if (0 < iVar4) {
    do {
      uVar16._0_2_ = pAVar31->fx;
      uVar16._2_2_ = pAVar31->fy;
      uVar16._4_4_ = *(undefined4 *)&pAVar31->field_0x1c;
      uVar48 = (undefined2)((uint)uVar16._4_4_ >> 0x10);
      auVar44._8_4_ = 0;
      auVar44._0_8_ = uVar16;
      auVar44._12_2_ = uVar48;
      auVar44._14_2_ = uVar48;
      auVar43._12_4_ = auVar44._12_4_;
      auVar43._8_2_ = 0;
      auVar43._0_8_ = uVar16;
      auVar43._10_2_ = (short)uVar16._4_4_;
      auVar42._10_6_ = auVar43._10_6_;
      auVar42._8_2_ = (short)uVar16._4_4_;
      auVar42._0_8_ = uVar16;
      auVar6._4_8_ = auVar42._8_8_;
      auVar6._2_2_ = uVar16._2_2_;
      auVar6._0_2_ = uVar16._2_2_;
      *(int *)&pAVar31->u = auVar6._0_4_ >> 0x10;
      *(uint *)((long)&pAVar31->u + 4) = -(uint)(auVar6._0_4_ < 0);
      *(int *)&pAVar31->v = (int)(short)(undefined2)uVar16;
      *(uint *)((long)&pAVar31->v + 4) = -(uint)((short)(undefined2)uVar16 < 0);
      pAVar31 = pAVar31 + 1;
    } while (pAVar31 < pAVar34);
  }
  local_98 = hints->axis + dim;
  if (0 < iVar3) {
    local_78 = local_70 + iVar3;
    local_b0 = (ulong)(uVar22 >> 1) / 7;
    local_b8 = hints->axis[dim].embedded.segments;
    pAVar15 = (AF_Segment_conflict)0x0;
    AVar27 = local_cc;
LAB_00267e95:
    pAVar31 = *local_70;
    bVar20 = pAVar31->prev->out_dir;
    bVar19 = (char)bVar20 >> 7;
    pAVar38 = pAVar31;
    if ((local_cc == (uint)(byte)((bVar20 ^ bVar19) - bVar19)) &&
       (bVar20 = pAVar31->out_dir >> 7,
       local_cc == (uint)(byte)((pAVar31->out_dir ^ bVar20) - bVar20))) {
      do {
        pAVar38 = pAVar38->prev;
        bVar20 = pAVar38->out_dir >> 7;
        if (local_cc != (uint)(byte)((pAVar38->out_dir ^ bVar20) - bVar20)) {
          pAVar38 = pAVar38->next;
          break;
        }
      } while (pAVar38 != pAVar31);
    }
    lVar36 = -32000;
    lVar21 = 32000;
    local_f0 = 0;
    lVar35 = -32000;
    local_f8 = 0;
    local_fc = 0;
    lVar28 = 32000;
    lVar25 = -32000;
    local_80 = 0;
    pAVar14 = (AF_Segment_conflict)0x0;
    local_e0 = 32000;
    local_d8 = -32000;
    local_c0 = 32000;
    local_c8 = -32000;
    local_e4 = 0;
    local_e8 = 0;
    local_a0 = 32000;
    local_a8 = -32000;
    lVar18 = 32000;
    pAVar26 = pAVar15;
    pAVar31 = pAVar38;
    local_90 = pAVar38;
    do {
      pAVar12 = local_98;
      bVar40 = true;
      pAVar15 = pAVar26;
      lVar32 = lVar18;
      pAVar37 = pAVar14;
      if ((int)local_f0 != 0) {
        lVar23 = pAVar38->u;
        if (lVar23 < lVar21) {
          lVar21 = lVar23;
        }
        if (lVar36 < lVar23) {
          lVar36 = lVar23;
        }
        lVar23 = pAVar38->v;
        if (lVar23 < lVar18) {
          lVar32 = lVar23;
        }
        uVar2 = pAVar38->flags;
        if (lVar23 < lVar18) {
          local_f8 = (uint)uVar2;
        }
        if (lVar35 < lVar23) {
          local_fc = (uint)uVar2;
          lVar35 = lVar23;
        }
        lVar18 = lVar28;
        if (lVar23 < lVar28) {
          lVar18 = lVar23;
        }
        if (lVar23 <= lVar25) {
          lVar23 = lVar25;
        }
        if ((uVar2 & 3) != 0) {
          lVar23 = lVar25;
          lVar18 = lVar28;
        }
        lVar28 = lVar18;
        lVar25 = lVar23;
        if ((AVar27 == pAVar38->out_dir) && (pAVar38 != pAVar31)) {
          bVar40 = false;
        }
        else {
          sVar30 = (short)lVar32;
          sVar33 = (short)lVar35;
          if ((pAVar14 == (AF_Segment_conflict)0x0) || (pAVar26->first != pAVar14->last)) {
            pAVar26->last = pAVar38;
            pAVar26->pos = (FT_Short)((uint)((int)lVar21 + (int)lVar36) >> 1);
            pAVar26->delta = (FT_Short)((uint)((int)lVar36 - (int)lVar21) >> 1);
            bVar40 = true;
            if ((((local_fc | local_f8) & 3) != 0) && (lVar25 - lVar28 < (long)local_b0)) {
              pAVar26->flags = pAVar26->flags | 1;
            }
            pAVar26->min_coord = sVar30;
            pAVar26->max_coord = sVar33;
            pAVar26->height = sVar33 - sVar30;
            pAVar14 = (AF_Segment_conflict)(ulong)local_fc;
            pAVar15 = (AF_Segment_conflict)0x0;
            pAVar37 = pAVar26;
            local_e8 = local_fc;
            local_e4 = local_f8;
            local_e0 = lVar21;
            local_d8 = lVar36;
            local_c8 = lVar35;
            local_c0 = lVar32;
            local_a8 = lVar25;
            local_a0 = lVar28;
          }
          else {
            bVar40 = true;
            if (pAVar14->last->in_dir == pAVar38->in_dir) {
              if (local_e0 < lVar21) {
                lVar21 = local_e0;
              }
              if (lVar36 < local_d8) {
                lVar36 = local_d8;
              }
              if (local_c0 < lVar32) {
                local_f8 = local_e4;
                lVar32 = local_c0;
              }
              if (lVar35 < local_c8) {
                local_fc = local_e8;
                lVar35 = local_c8;
              }
              if (local_a0 < lVar28) {
                lVar28 = local_a0;
              }
              if (lVar25 < local_a8) {
                lVar25 = local_a8;
              }
              pAVar14->last = pAVar38;
              pAVar14->pos = (FT_Short)((uint)((int)lVar21 + (int)lVar36) >> 1);
              pAVar14->delta = (FT_Short)((uint)((int)lVar36 - (int)lVar21) >> 1);
              pAVar14->flags =
                   pAVar14->flags & 0xfe |
                   (lVar25 - lVar28 < (long)local_b0 && ((local_fc | local_f8) & 3) != 0);
              pAVar14->min_coord = (short)lVar32;
              pAVar14->max_coord = (short)lVar35;
              pAVar14->height = (short)lVar35 - (short)lVar32;
            }
            else {
              uVar16 = local_c8 - local_c0;
              uVar29 = -uVar16;
              if (0 < (long)uVar16) {
                uVar29 = uVar16;
              }
              uVar17 = lVar35 - lVar32;
              uVar16 = -uVar17;
              if (0 < (long)uVar17) {
                uVar16 = uVar17;
              }
              if (uVar16 < uVar29) {
                if (lVar21 < local_e0) {
                  local_e0 = lVar21;
                }
                if (local_d8 < lVar36) {
                  local_d8 = lVar36;
                }
                pAVar14->last = pAVar38;
                pAVar14->pos = (FT_Short)((uint)((int)local_e0 + (int)local_d8) >> 1);
                pAVar14->delta = (FT_Short)((uint)((int)local_d8 - (int)local_e0) >> 1);
              }
              else {
                if (local_e0 < lVar21) {
                  lVar21 = local_e0;
                }
                if (lVar36 < local_d8) {
                  lVar36 = local_d8;
                }
                pAVar26->last = pAVar38;
                pAVar26->pos = (FT_Short)((uint)((int)lVar21 + (int)lVar36) >> 1);
                pAVar26->delta = (FT_Short)((uint)((int)lVar36 - (int)lVar21) >> 1);
                if ((((local_fc | local_f8) & 3) != 0) && (lVar25 - lVar28 < (long)local_b0)) {
                  pAVar26->flags = pAVar26->flags | 1;
                }
                pAVar26->min_coord = sVar30;
                pAVar26->max_coord = sVar33;
                pAVar26->height = sVar33 - sVar30;
                pAVar15 = pAVar14;
                for (lVar18 = 10; local_e8 = local_fc, local_e4 = local_f8, local_e0 = lVar21,
                    local_d8 = lVar36, local_c8 = lVar35, local_c0 = lVar32, local_a8 = lVar25,
                    local_a0 = lVar28, lVar18 != 0; lVar18 = lVar18 + -1) {
                  FVar8 = pAVar26->dir;
                  FVar9 = pAVar26->pos;
                  FVar10 = pAVar26->delta;
                  FVar11 = pAVar26->min_coord;
                  pAVar15->flags = pAVar26->flags;
                  pAVar15->dir = FVar8;
                  pAVar15->pos = FVar9;
                  pAVar15->delta = FVar10;
                  pAVar15->min_coord = FVar11;
                  pAVar26 = (AF_Segment_conflict)((long)pAVar26 + (ulong)bVar41 * -0x10 + 8);
                  pAVar15 = (AF_Segment_conflict)((long)pAVar15 + (ulong)bVar41 * -0x10 + 8);
                }
              }
            }
            local_98->num_segments = local_98->num_segments - 1;
            pAVar15 = (AF_Segment_conflict)0x0;
          }
        }
      }
      if (pAVar38 == pAVar31) {
        bVar39 = (char)local_80 != '\0';
        local_80 = CONCAT71((int7)((ulong)pAVar14 >> 8),1);
        if (bVar39) goto LAB_00268519;
      }
      pAVar14 = pAVar37;
      if (bVar40) {
        cVar1 = pAVar38->out_dir;
        AVar24 = (AF_Direction)cVar1;
        AVar13 = -AVar24;
        if (~AF_DIR_LEFT < AVar24) {
          AVar13 = AVar24;
        }
        if ((AVar13 == local_cc) || (pAVar38 == pAVar38->prev)) {
          uVar22 = local_98->num_segments;
          if (1000 < uVar22) {
            local_98->num_segments = 0;
            return 0;
          }
          local_f4 = 0;
          if (uVar22 < 0x12) {
            local_f0 = 1;
            pAVar14 = local_98->segments;
            if (local_98->segments == (AF_Segment_conflict)0x0) {
              local_98->segments = local_b8;
              local_98->max_segments = 0x12;
              pAVar14 = local_b8;
            }
          }
          else {
            uVar5 = local_98->max_segments;
            pAVar14 = local_98->segments;
            if (uVar22 < uVar5) {
              local_f0 = 1;
            }
            else {
              local_f0 = 1;
              uVar22 = uVar5 + (uVar5 >> 2) + 4;
              if (pAVar14 == local_b8) {
                pAVar15 = (AF_Segment_conflict)
                          ft_mem_realloc(local_88,0x50,0,(ulong)uVar22,(void *)0x0,&local_f4);
                pAVar12->segments = pAVar15;
                if (local_f4 != 0) {
                  return local_f4;
                }
                memcpy(pAVar15,local_b8,0x5a0);
                pAVar14 = pAVar12->segments;
              }
              else {
                pAVar14 = (AF_Segment_conflict)
                          ft_mem_realloc(local_88,0x50,(ulong)uVar5,(ulong)uVar22,pAVar14,&local_f4)
                ;
                pAVar12->segments = pAVar14;
                if (local_f4 != 0) {
                  return local_f4;
                }
              }
              pAVar12->max_segments = uVar22;
              uVar22 = pAVar12->num_segments;
            }
          }
          pAVar12->num_segments = uVar22 + 1;
          pAVar15 = pAVar14 + uVar22;
          pAVar14 = pAVar14 + uVar22;
          pAVar14->flags = '\0';
          *(undefined8 *)&pAVar14->dir = local_68._0_8_;
          *(undefined8 *)((long)&pAVar14->max_coord + 1) = local_68._8_8_;
          *(undefined8 *)((long)&pAVar14->edge + 1) = uStack_58;
          *(ulong *)((long)&pAVar14->edge_next + 1) = CONCAT17((undefined1)local_49,uStack_50);
          *(undefined4 *)&pAVar14->link = local_49;
          *(undefined4 *)((long)&pAVar14->link + 4) = uStack_45;
          *(undefined4 *)&pAVar14->serif = uStack_41;
          *(undefined4 *)((long)&pAVar14->serif + 4) = uStack_3d;
          pAVar14->score = 32000;
          pAVar14->len = 0;
          pAVar14->dir = cVar1;
          pAVar14->first = pAVar38;
          pAVar14->last = pAVar38;
          pAVar14 = pAVar14 + -1;
          if (pAVar37 == (AF_Segment_conflict)0x0) {
            pAVar14 = pAVar37;
          }
          lVar21 = pAVar38->u;
          lVar32 = pAVar38->v;
          uVar2 = pAVar38->flags;
          bVar40 = (uVar2 & 3) == 0;
          lVar28 = 32000;
          if (bVar40) {
            lVar28 = lVar32;
          }
          lVar25 = -32000;
          if (bVar40) {
            lVar25 = lVar32;
          }
          local_fc = (uint)uVar2;
          lVar35 = lVar32;
          lVar36 = lVar21;
          pAVar31 = local_90;
          local_f8 = local_fc;
          if (pAVar38 == pAVar38->prev) {
            pAVar15->pos = (FT_Short)lVar21;
            if ((uVar2 & 3) != 0) {
              pAVar15->flags = '\x01';
            }
            pAVar15->min_coord = (FT_Short)lVar32;
            pAVar15->max_coord = (FT_Short)lVar32;
            pAVar15->height = 0;
            pAVar15 = (AF_Segment_conflict)0x0;
            local_f0 = 0;
          }
        }
        else {
          local_f0 = 0;
          pAVar31 = local_90;
          AVar24 = AVar27;
        }
      }
      else {
        local_f0 = 1;
        AVar24 = AVar27;
      }
      pAVar38 = pAVar38->next;
      lVar18 = lVar32;
      pAVar26 = pAVar15;
      AVar27 = AVar24;
    } while( true );
  }
LAB_00268558:
  pAVar15 = local_98->segments;
  if ((pAVar15 != (AF_Segment_conflict)0x0) && ((ulong)local_98->num_segments != 0)) {
    pAVar14 = pAVar15 + local_98->num_segments;
    do {
      pAVar31 = pAVar15->last;
      lVar21 = pAVar15->first->v;
      lVar28 = pAVar31->v;
      lVar35 = pAVar15->first->prev->v;
      if (lVar21 < lVar28) {
        if (lVar35 < lVar21) {
          pAVar15->height = pAVar15->height + (short)((uint)((int)lVar21 - (int)lVar35) >> 1);
        }
        lVar21 = pAVar31->next->v;
        uVar29 = lVar21 - lVar28;
        if (uVar29 != 0 && lVar28 <= lVar21) {
LAB_002685ce:
          pAVar15->height = pAVar15->height + (short)(uVar29 >> 1);
        }
      }
      else {
        if (lVar21 < lVar35) {
          pAVar15->height = pAVar15->height + (short)((uint)((int)lVar35 - (int)lVar21) >> 1);
        }
        lVar21 = pAVar31->next->v;
        uVar29 = lVar28 - lVar21;
        if (uVar29 != 0 && lVar21 <= lVar28) goto LAB_002685ce;
      }
      pAVar15 = pAVar15 + 1;
    } while (pAVar15 < pAVar14);
  }
  return 0;
LAB_00268519:
  local_70 = local_70 + 1;
  if (local_78 <= local_70) goto LAB_00268558;
  goto LAB_00267e95;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_hints_compute_segments( AF_GlyphHints  hints,
                                   AF_Dimension   dim )
  {
    AF_LatinMetrics  metrics       = (AF_LatinMetrics)hints->metrics;
    AF_AxisHints     axis          = &hints->axis[dim];
    FT_Memory        memory        = hints->memory;
    FT_Error         error         = FT_Err_Ok;
    AF_Segment       segment       = NULL;
    AF_SegmentRec    seg0;
    AF_Point*        contour       = hints->contours;
    AF_Point*        contour_limit = contour + hints->num_contours;
    AF_Direction     major_dir, segment_dir;

    FT_Pos  flat_threshold = FLAT_THRESHOLD( metrics->units_per_em );


    FT_ZERO( &seg0 );
    seg0.score = 32000;
    seg0.flags = AF_EDGE_NORMAL;

    major_dir   = (AF_Direction)FT_ABS( axis->major_dir );
    segment_dir = major_dir;

    axis->num_segments = 0;

    /* set up (u,v) in each point */
    if ( dim == AF_DIMENSION_HORZ )
    {
      AF_Point  point = hints->points;
      AF_Point  limit = point + hints->num_points;


      for ( ; point < limit; point++ )
      {
        point->u = point->fx;
        point->v = point->fy;
      }
    }
    else
    {
      AF_Point  point = hints->points;
      AF_Point  limit = point + hints->num_points;


      for ( ; point < limit; point++ )
      {
        point->u = point->fy;
        point->v = point->fx;
      }
    }

    /* do each contour separately */
    for ( ; contour < contour_limit; contour++ )
    {
      AF_Point  point   = contour[0];
      AF_Point  last    = point->prev;
      int       on_edge = 0;

      /* we call values measured along a segment (point->v)    */
      /* `coordinates', and values orthogonal to it (point->u) */
      /* `positions'                                           */
      FT_Pos     min_pos      =  32000;
      FT_Pos     max_pos      = -32000;
      FT_Pos     min_coord    =  32000;
      FT_Pos     max_coord    = -32000;
      FT_UShort  min_flags    =  AF_FLAG_NONE;
      FT_UShort  max_flags    =  AF_FLAG_NONE;
      FT_Pos     min_on_coord =  32000;
      FT_Pos     max_on_coord = -32000;

      FT_Bool  passed;

      AF_Segment  prev_segment = NULL;

      FT_Pos     prev_min_pos      = min_pos;
      FT_Pos     prev_max_pos      = max_pos;
      FT_Pos     prev_min_coord    = min_coord;
      FT_Pos     prev_max_coord    = max_coord;
      FT_UShort  prev_min_flags    = min_flags;
      FT_UShort  prev_max_flags    = max_flags;
      FT_Pos     prev_min_on_coord = min_on_coord;
      FT_Pos     prev_max_on_coord = max_on_coord;


      if ( FT_ABS( last->out_dir )  == major_dir &&
           FT_ABS( point->out_dir ) == major_dir )
      {
        /* we are already on an edge, try to locate its start */
        last = point;

        for (;;)
        {
          point = point->prev;
          if ( FT_ABS( point->out_dir ) != major_dir )
          {
            point = point->next;
            break;
          }
          if ( point == last )
            break;
        }
      }

      last   = point;
      passed = 0;

      for (;;)
      {
        FT_Pos  u, v;


        if ( on_edge )
        {
          /* get minimum and maximum position */
          u = point->u;
          if ( u < min_pos )
            min_pos = u;
          if ( u > max_pos )
            max_pos = u;

          /* get minimum and maximum coordinate together with flags */
          v = point->v;
          if ( v < min_coord )
          {
            min_coord = v;
            min_flags = point->flags;
          }
          if ( v > max_coord )
          {
            max_coord = v;
            max_flags = point->flags;
          }

          /* get minimum and maximum coordinate of `on' points */
          if ( !( point->flags & AF_FLAG_CONTROL ) )
          {
            v = point->v;
            if ( v < min_on_coord )
              min_on_coord = v;
            if ( v > max_on_coord )
              max_on_coord = v;
          }

          if ( point->out_dir != segment_dir || point == last )
          {
            /* check whether the new segment's start point is identical to */
            /* the previous segment's end point; for example, this might   */
            /* happen for spikes                                           */

            if ( !prev_segment || segment->first != prev_segment->last )
            {
              /* points are different: we are just leaving an edge, thus */
              /* record a new segment                                    */

              segment->last  = point;
              segment->pos   = (FT_Short)( ( min_pos + max_pos ) >> 1 );
              segment->delta = (FT_Short)( ( max_pos - min_pos ) >> 1 );

              /* a segment is round if either its first or last point */
              /* is a control point, and the length of the on points  */
              /* inbetween doesn't exceed a heuristic limit           */
              if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                   ( max_on_coord - min_on_coord ) < flat_threshold )
                segment->flags |= AF_EDGE_ROUND;

              segment->min_coord = (FT_Short)min_coord;
              segment->max_coord = (FT_Short)max_coord;
              segment->height    = segment->max_coord - segment->min_coord;

              prev_segment      = segment;
              prev_min_pos      = min_pos;
              prev_max_pos      = max_pos;
              prev_min_coord    = min_coord;
              prev_max_coord    = max_coord;
              prev_min_flags    = min_flags;
              prev_max_flags    = max_flags;
              prev_min_on_coord = min_on_coord;
              prev_max_on_coord = max_on_coord;
            }
            else
            {
              /* points are the same: we don't create a new segment but */
              /* merge the current segment with the previous one        */

              if ( prev_segment->last->in_dir == point->in_dir )
              {
                /* we have identical directions (this can happen for       */
                /* degenerate outlines that move zig-zag along the main    */
                /* axis without changing the coordinate value of the other */
                /* axis, and where the segments have just been merged):    */
                /* unify segments                                          */

                /* update constraints */

                if ( prev_min_pos < min_pos )
                  min_pos = prev_min_pos;
                if ( prev_max_pos > max_pos )
                  max_pos = prev_max_pos;

                if ( prev_min_coord < min_coord )
                {
                  min_coord = prev_min_coord;
                  min_flags = prev_min_flags;
                }
                if ( prev_max_coord > max_coord )
                {
                  max_coord = prev_max_coord;
                  max_flags = prev_max_flags;
                }

                if ( prev_min_on_coord < min_on_coord )
                  min_on_coord = prev_min_on_coord;
                if ( prev_max_on_coord > max_on_coord )
                  max_on_coord = prev_max_on_coord;

                prev_segment->last  = point;
                prev_segment->pos   = (FT_Short)( ( min_pos +
                                                    max_pos ) >> 1 );
                prev_segment->delta = (FT_Short)( ( max_pos -
                                                    min_pos ) >> 1 );

                if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                     ( max_on_coord - min_on_coord ) < flat_threshold )
                  prev_segment->flags |= AF_EDGE_ROUND;
                else
                  prev_segment->flags &= ~AF_EDGE_ROUND;

                prev_segment->min_coord = (FT_Short)min_coord;
                prev_segment->max_coord = (FT_Short)max_coord;
                prev_segment->height    = prev_segment->max_coord -
                                          prev_segment->min_coord;
              }
              else
              {
                /* we have different directions; use the properties of the */
                /* longer segment and discard the other one                */

                if ( FT_ABS( prev_max_coord - prev_min_coord ) >
                     FT_ABS( max_coord - min_coord ) )
                {
                  /* discard current segment */

                  if ( min_pos < prev_min_pos )
                    prev_min_pos = min_pos;
                  if ( max_pos > prev_max_pos )
                    prev_max_pos = max_pos;

                  prev_segment->last  = point;
                  prev_segment->pos   = (FT_Short)( ( prev_min_pos +
                                                      prev_max_pos ) >> 1 );
                  prev_segment->delta = (FT_Short)( ( prev_max_pos -
                                                      prev_min_pos ) >> 1 );
                }
                else
                {
                  /* discard previous segment */

                  if ( prev_min_pos < min_pos )
                    min_pos = prev_min_pos;
                  if ( prev_max_pos > max_pos )
                    max_pos = prev_max_pos;

                  segment->last  = point;
                  segment->pos   = (FT_Short)( ( min_pos + max_pos ) >> 1 );
                  segment->delta = (FT_Short)( ( max_pos - min_pos ) >> 1 );

                  if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                       ( max_on_coord - min_on_coord ) < flat_threshold )
                    segment->flags |= AF_EDGE_ROUND;

                  segment->min_coord = (FT_Short)min_coord;
                  segment->max_coord = (FT_Short)max_coord;
                  segment->height    = segment->max_coord -
                                       segment->min_coord;

                  *prev_segment = *segment;

                  prev_min_pos      = min_pos;
                  prev_max_pos      = max_pos;
                  prev_min_coord    = min_coord;
                  prev_max_coord    = max_coord;
                  prev_min_flags    = min_flags;
                  prev_max_flags    = max_flags;
                  prev_min_on_coord = min_on_coord;
                  prev_max_on_coord = max_on_coord;
                }
              }

              axis->num_segments--;
            }

            on_edge = 0;
            segment = NULL;

            /* fall through */
          }
        }

        /* now exit if we are at the start/end point */
        if ( point == last )
        {
          if ( passed )
            break;
          passed = 1;
        }

        /* if we are not on an edge, check whether the major direction */
        /* coincides with the current point's `out' direction, or      */
        /* whether we have a single-point contour                      */
        if ( !on_edge                                  &&
             ( FT_ABS( point->out_dir ) == major_dir ||
               point == point->prev                  ) )
        {
          /*
           * For efficiency, we restrict the number of segments to 1000,
           * which is a heuristic value: it is very unlikely that a glyph
           * with so many segments can be hinted in a sensible way.
           * Reasons:
           *
           * - The glyph has really 1000 segments; this implies that it has
           *   at least 2000 outline points.  Assuming 'normal' fonts that
           *   have superfluous points optimized away, viewing such a glyph
           *   only makes sense at large magnifications where hinting
           *   isn't applied anyway.
           *
           * - We have a broken glyph.  Hinting doesn't make sense in this
           *   case either.
           */
          if ( axis->num_segments > 1000 )
          {
            FT_TRACE0(( "af_latin_hints_compute_segments:"
                        " more than 1000 segments in this glyph;\n" ));
            FT_TRACE0(( "                                "
                        " hinting is suppressed\n" ));
            axis->num_segments = 0;
            return FT_Err_Ok;
          }

          /* this is the start of a new segment! */
          segment_dir = (AF_Direction)point->out_dir;

          error = af_axis_hints_new_segment( axis, memory, &segment );
          if ( error )
            goto Exit;

          /* clear all segment fields */
          segment[0] = seg0;

          segment->dir   = (FT_Char)segment_dir;
          segment->first = point;
          segment->last  = point;

          /* `af_axis_hints_new_segment' reallocates memory,    */
          /* thus we have to refresh the `prev_segment' pointer */
          if ( prev_segment )
            prev_segment = segment - 1;

          min_pos   = max_pos   = point->u;
          min_coord = max_coord = point->v;
          min_flags = max_flags = point->flags;

          if ( point->flags & AF_FLAG_CONTROL )
          {
            min_on_coord =  32000;
            max_on_coord = -32000;
          }
          else
            min_on_coord = max_on_coord = point->v;

          on_edge = 1;

          if ( point == point->prev )
          {
            /* we have a one-point segment: this is a one-point */
            /* contour with `in' and `out' direction set to     */
            /* AF_DIR_NONE                                      */
            segment->pos = (FT_Short)min_pos;

            if (point->flags & AF_FLAG_CONTROL)
              segment->flags |= AF_EDGE_ROUND;

            segment->min_coord = (FT_Short)point->v;
            segment->max_coord = (FT_Short)point->v;
            segment->height = 0;

            on_edge = 0;
            segment = NULL;
          }
        }

        point = point->next;
      }

    } /* contours */


    /* now slightly increase the height of segments if this makes */
    /* sense -- this is used to better detect and ignore serifs   */
    {
      AF_Segment  segments     = axis->segments;
      AF_Segment  segments_end = FT_OFFSET( segments, axis->num_segments );


      for ( segment = segments; segment < segments_end; segment++ )
      {
        AF_Point  first   = segment->first;
        AF_Point  last    = segment->last;
        FT_Pos    first_v = first->v;
        FT_Pos    last_v  = last->v;


        if ( first_v < last_v )
        {
          AF_Point  p;


          p = first->prev;
          if ( p->v < first_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( first_v - p->v ) >> 1 ) );

          p = last->next;
          if ( p->v > last_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( p->v - last_v ) >> 1 ) );
        }
        else
        {
          AF_Point  p;


          p = first->prev;
          if ( p->v > first_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( p->v - first_v ) >> 1 ) );

          p = last->next;
          if ( p->v < last_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( last_v - p->v ) >> 1 ) );
        }
      }
    }

  Exit:
    return error;
  }